

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

void CheckStopped(AActor *self)

{
  bool bVar1;
  AActor *self_local;
  
  if (((self->player != (player_t *)0x0) && (self->player->mo == (APlayerPawn *)self)) &&
     ((self->player->cheats & 0x2000U) == 0)) {
    bVar1 = TVector3<double>::isZero(&self->Vel);
    if (!bVar1) {
      APlayerPawn::PlayIdle(self->player->mo);
      TVector2<double>::Zero(&self->player->Vel);
    }
  }
  return;
}

Assistant:

static void CheckStopped(AActor *self)
{
	if (self->player != NULL &&
		self->player->mo == self &&
		!(self->player->cheats & CF_PREDICTING) && !self->Vel.isZero())
	{
		self->player->mo->PlayIdle();
		self->player->Vel.Zero();
	}
}